

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_assertion_tests.cpp
# Opt level: O3

void string_does_not_contain_stl_string_pointer(void)

{
  string *psVar1;
  Constraint *constraint;
  
  psVar1 = (string *)operator_new(0x20);
  (psVar1->_M_dataplus)._M_p = (pointer)&psVar1->field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)psVar1,"bob","");
  bob_pointer_abi_cxx11_ = psVar1;
  constraint = (Constraint *)
               cgreen::create_does_not_contain_string_constraint((string *)psVar1,"bob_pointer");
  cgreen::assert_that_<char_const*>
            ("/workspace/llm4binary/github/license_c_cmakelists/cgreen-devs[P]cgreen/tests/cpp_assertion_tests.cpp"
             ,0x61,"\"alice\"","alice",constraint);
  return;
}

Assistant:

Ensure(string_does_not_contain_stl_string_pointer) {
    bob_pointer = new std::string("bob");
    assert_that("alice", does_not_contain_string(bob_pointer));
}